

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv6Transmitter::JoinMulticastGroup(RTPUDPv6Transmitter *this,RTPAddress *addr)

{
  AddressType AVar1;
  int iVar2;
  undefined8 local_7c;
  ipv6_mreq mreq_2;
  ipv6_mreq mreq_1;
  ipv6_mreq mreq;
  in6_addr mcastIP;
  RTPIPv6Address *address;
  int status;
  RTPAddress *addr_local;
  RTPUDPv6Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x72;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x71;
  }
  else {
    AVar1 = RTPAddress::GetAddressType(addr);
    if (AVar1 == IPv6Address) {
      join_0x00000010_0x00000000_ =
           (anon_union_16_3_a3f0114d_for___in6_u)RTPIPv6Address::GetIP((RTPIPv6Address *)addr);
      if (mreq.ipv6mr_multiaddr.__in6_u.__u6_addr8[0xc] == 0xff) {
        address._4_4_ =
             RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
             AddElement(&this->multicastgroups,
                        (in6_addr *)((long)&mreq.ipv6mr_multiaddr.__in6_u + 0xc));
        if (-1 < address._4_4_) {
          mreq_1._12_8_ = mreq._12_8_;
          mreq.ipv6mr_multiaddr.__in6_u._0_8_ = mcastIP.__in6_u._0_8_;
          mreq.ipv6mr_multiaddr.__in6_u.__u6_addr32[2] = this->mcastifidx;
          iVar2 = setsockopt(this->rtpsock,0x29,0x14,
                             (void *)((long)&mreq_1.ipv6mr_multiaddr.__in6_u + 0xc),0x14);
          if (iVar2 != 0) {
            RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
            DeleteElement(&this->multicastgroups,
                          (in6_addr *)((long)&mreq.ipv6mr_multiaddr.__in6_u + 0xc));
            return -0x69;
          }
          mreq_2._12_8_ = mreq._12_8_;
          mreq_1.ipv6mr_multiaddr.__in6_u._0_8_ = mcastIP.__in6_u._0_8_;
          mreq_1.ipv6mr_multiaddr.__in6_u.__u6_addr32[2] = this->mcastifidx;
          iVar2 = setsockopt(this->rtcpsock,0x29,0x14,
                             (void *)((long)&mreq_2.ipv6mr_multiaddr.__in6_u + 0xc),0x14);
          if (iVar2 != 0) {
            local_7c = mreq._12_8_;
            mreq_2.ipv6mr_multiaddr.__in6_u._0_8_ = mcastIP.__in6_u._0_8_;
            mreq_2.ipv6mr_multiaddr.__in6_u.__u6_addr32[2] = this->mcastifidx;
            setsockopt(this->rtpsock,0x29,0x15,&local_7c,0x14);
            RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
            DeleteElement(&this->multicastgroups,
                          (in6_addr *)((long)&mreq.ipv6mr_multiaddr.__in6_u + 0xc));
            return -0x69;
          }
          address._4_4_ = 0;
        }
        this_local._4_4_ = address._4_4_;
      }
      else {
        this_local._4_4_ = -0x70;
      }
    }
    else {
      this_local._4_4_ = -0x6c;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv6Transmitter::JoinMulticastGroup(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv6Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_INVALIDADDRESSTYPE;
	}
	
	const RTPIPv6Address &address = (const RTPIPv6Address &)addr;
	in6_addr mcastIP = address.GetIP();
	
	if (!RTPUDPV6TRANS_IS_MCASTADDR(mcastIP))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTAMULTICASTADDRESS;
	}
	
	status = multicastgroups.AddElement(mcastIP);
	if (status >= 0)
	{
		RTPUDPV6TRANS_MCASTMEMBERSHIP(rtpsock,IPV6_JOIN_GROUP,mcastIP,status);
		if (status != 0)
		{
			multicastgroups.DeleteElement(mcastIP);
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV6TRANS_COULDNTJOINMULTICASTGROUP;
		}
		RTPUDPV6TRANS_MCASTMEMBERSHIP(rtcpsock,IPV6_JOIN_GROUP,mcastIP,status);
		if (status != 0)
		{
			RTPUDPV6TRANS_MCASTMEMBERSHIP(rtpsock,IPV6_LEAVE_GROUP,mcastIP,status);
			multicastgroups.DeleteElement(mcastIP);
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV6TRANS_COULDNTJOINMULTICASTGROUP;
		}
	}
	MAINMUTEX_UNLOCK	
	return status;
}